

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional_ptr.hpp
# Opt level: O0

void __thiscall
duckdb::optional_ptr<duckdb::SchemaCatalogEntry,_true>::CheckValid
          (optional_ptr<duckdb::SchemaCatalogEntry,_true> *this)

{
  InternalException *this_00;
  long *in_RDI;
  string *in_stack_ffffffffffffffa8;
  allocator local_29;
  string local_28 [40];
  
  if (*in_RDI == 0) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_28,"Attempting to dereference an optional pointer that is not set",&local_29);
    InternalException::InternalException(this_00,in_stack_ffffffffffffffa8);
    __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
  }
  return;
}

Assistant:

void CheckValid() const {
		if (MemorySafety<SAFE>::ENABLED) {
			if (!ptr) {
				throw InternalException("Attempting to dereference an optional pointer that is not set");
			}
		}
	}